

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveDifferentArenas_Test::TestBody
          (MovableMessageTest_MoveDifferentArenas_Test *this)

{
  TestAllTypes *message;
  TestAllTypes *this_00;
  ulong uVar1;
  ulong uVar2;
  pointer *__ptr;
  char *message_00;
  AssertionResult gtest_ar;
  TestAllTypes_NestedMessage *nested;
  Arena arena2;
  Arena arena1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  AssertHelper local_180;
  internal local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  TestAllTypes_NestedMessage *local_168;
  ThreadSafeArena local_160;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_160);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_b8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  local_168 = (message->field_0)._impl_.optional_nested_message_;
  if (local_168 == (TestAllTypes_NestedMessage *)0x0) {
    local_168 = (TestAllTypes_NestedMessage *)
                &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  this_00 = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_160);
  if (this_00 != message) {
    uVar1 = (this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    uVar2 = (message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    if (uVar1 == uVar2) {
      proto2_unittest::TestAllTypes::InternalSwap(this_00,message);
    }
    else {
      proto2_unittest::TestAllTypes::CopyFrom(this_00,message);
    }
  }
  local_188._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&this_00->field_0 + 0x210);
  if (local_188._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_188._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  testing::internal::
  CmpHelperNE<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            (local_178,"nested","&message2_on_arena->optional_nested_message()",&local_168,
             (TestAllTypes_NestedMessage **)&local_188);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message_00 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x5f,message_00);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(this_00);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_160);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveDifferentArenas) {
  Arena arena1, arena2;

  auto* message1_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena1);
  TestUtil::SetAllFields(message1_on_arena);
  const auto* nested = &message1_on_arena->optional_nested_message();

  auto* message2_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena2);

  // Moving messages on two different arenas should lead to a copy.
  *message2_on_arena = std::move(*message1_on_arena);
  EXPECT_NE(nested, &message2_on_arena->optional_nested_message());
  TestUtil::ExpectAllFieldsSet(*message1_on_arena);
  TestUtil::ExpectAllFieldsSet(*message2_on_arena);
}